

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compoundfile_stream_and_dir.hpp
# Opt level: O1

void __thiscall CompoundFile::Stream::seek(Stream *this,int32_t pos,SeekType type)

{
  int iVar1;
  int iVar2;
  pointer pSVar3;
  Header *pHVar4;
  int iVar5;
  int iVar6;
  ulong uVar7;
  int iVar8;
  
  if (type == FromCurrent) {
    pos = pos + this->m_bytesReaded;
    if (pos < 0) {
      pos = pos + this->m_streamSize;
    }
    goto LAB_00119253;
  }
  if (pos < 1 || type != FromEnd) {
    if (pos < 0 && type == FromEnd) {
      pos = -pos;
      goto LAB_00119253;
    }
    if (type != FromBeginning || -1 < pos) goto LAB_00119253;
  }
  pos = this->m_streamSize - pos;
LAB_00119253:
  if (this->m_streamSize <= pos) {
    this->m_bytesReaded = this->m_streamSize;
    return;
  }
  iVar1 = this->m_sectorSize;
  iVar5 = pos / iVar1;
  iVar6 = pos % iVar1;
  this->m_bytesReaded = pos;
  this->m_sectorBytesReaded = iVar6;
  if (this->m_mode == LargeStream) {
    this->m_largeSecIDIdx = iVar5;
    uVar7 = (ulong)iVar5;
    pSVar3 = (this->m_largeStreamChain).
             super__Vector_base<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (uVar7 < (ulong)((long)(this->m_largeStreamChain).
                              super__Vector_base<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar3 >> 2)) {
      if ((this->m_currentLargeSectorID).m_id != pSVar3[uVar7].m_id) {
        (this->m_currentLargeSectorID).m_id = pSVar3[uVar7].m_id;
        std::istream::seekg((long)this->m_stream,pSVar3[uVar7].m_id * iVar1 + 0x200);
        std::istream::read((char *)this->m_stream,
                           (long)(this->m_buf).super__Vector_base<char,_std::allocator<char>_>.
                                 _M_impl.super__Vector_impl_data._M_start);
      }
      this->m_pos = iVar6;
      return;
    }
  }
  else {
    pSVar3 = (this->m_shortStreamChain).
             super__Vector_base<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((ulong)(long)iVar5 <
        (ulong)((long)(this->m_shortStreamChain).
                      super__Vector_base<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_>.
                      _M_impl.super__Vector_impl_data._M_finish - (long)pSVar3 >> 2)) {
      iVar1 = pSVar3[iVar5].m_id;
      pHVar4 = this->m_header;
      pSVar3 = (this->m_largeStreamChain).
               super__Vector_base<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_>._M_impl
               .super__Vector_impl_data._M_start;
      iVar8 = pHVar4->m_sectorSize / pHVar4->m_shortSectorSize;
      uVar7 = (ulong)(iVar1 / iVar8);
      if (uVar7 < (ulong)((long)(this->m_largeStreamChain).
                                super__Vector_base<CompoundFile::SecID,_std::allocator<CompoundFile::SecID>_>
                                ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar3 >> 2)) {
        iVar2 = pSVar3[uVar7].m_id;
        this->m_shortSecIDIdx = iVar5;
        if ((this->m_currentLargeSectorID).m_id != iVar2) {
          (this->m_currentLargeSectorID).m_id = iVar2;
          std::istream::seekg((long)this->m_stream,pHVar4->m_sectorSize * iVar2 + 0x200);
          std::istream::read((char *)this->m_stream,
                             (long)(this->m_buf).super__Vector_base<char,_std::allocator<char>_>.
                                   _M_impl.super__Vector_impl_data._M_start);
        }
        this->m_pos = (iVar1 % iVar8) * this->m_header->m_shortSectorSize + iVar6;
        return;
      }
    }
  }
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
}

Assistant:

inline void
Stream::seek( int32_t pos, SeekType type )
{
	if( type == FromCurrent )
	{
		pos += m_bytesReaded;

		if( pos < 0 )
			pos += m_streamSize;
	}
	else if( type == FromEnd && pos > 0 )
		pos = m_streamSize - pos;
	else if( type == FromEnd && pos < 0 )
		pos = std::abs( pos );
	else if( type == FromBeginning && pos < 0 )
		pos = m_streamSize - pos;

	if( pos >= m_streamSize )
	{
		m_bytesReaded = m_streamSize;
		return;
	}

	const int32_t offset = pos % m_sectorSize;
	const int32_t sectorIdx = pos / m_sectorSize;

	m_bytesReaded = pos;
	m_sectorBytesReaded = offset;

	if( m_mode == LargeStream )
	{
		m_largeSecIDIdx = sectorIdx;

		if( m_currentLargeSectorID != m_largeStreamChain.at( m_largeSecIDIdx ) )
		{
			m_currentLargeSectorID = m_largeStreamChain.at( m_largeSecIDIdx );

			m_stream.seekg( calcFileOffset( m_largeStreamChain.at( m_largeSecIDIdx ),
				m_sectorSize ), std::ios::beg );

			m_stream.read( &m_buf[ 0 ], m_sectorSize );
		}

		m_pos = offset;
	}
	else
	{
		const SecID shortSector = m_shortStreamChain.at( sectorIdx );

		SecID largeSector;
		const int32_t offsetInLargeSector = whereIsShortSector( shortSector,
			largeSector );

		m_shortSecIDIdx = sectorIdx;

		if( m_currentLargeSectorID != largeSector )
		{
			m_currentLargeSectorID = largeSector;

			std::streampos pos = calcFileOffset( largeSector,
				m_header.sectorSize() );

			m_stream.seekg( pos, std::ios::beg );

			m_stream.read( &m_buf[ 0 ], m_header.sectorSize() );
		}

		m_pos = offsetInLargeSector * m_header.shortSectorSize();
		m_pos += offset;
	}
}